

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

int HRSS_generate_key(HRSS_public_key *out_pub,HRSS_private_key *out_priv,uint8_t *in)

{
  POLY_MUL_SCRATCH *out;
  poly *out_00;
  poly3 *r;
  long lVar1;
  byte *pbVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  crypto_word_t cVar6;
  crypto_word_t cVar7;
  crypto_word_t cVar8;
  uint uVar9;
  uint i;
  uint uVar10;
  uint8_t *r_00;
  POLY_MUL_SCRATCH *scratch;
  long lVar11;
  crypto_word_t *pcVar12;
  int iVar13;
  size_t i_1;
  long lVar14;
  undefined8 uVar15;
  poly3 *out_01;
  poly *x;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t i_8;
  size_t i_5;
  ulong uVar19;
  size_t i_4;
  ulong uVar20;
  anon_union_1408_2_d74be4fb_for_poly_0 *out_02;
  ulong uVar21;
  void *malloc_ptr;
  poly2 v;
  poly a;
  void *local_c50;
  undefined8 local_c48;
  undefined4 uStack_c40;
  undefined4 uStack_c3c;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 local_c28;
  undefined4 uStack_c24;
  undefined4 uStack_c20;
  undefined4 uStack_c1c;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_c08;
  undefined4 uStack_c04;
  undefined4 uStack_c00;
  undefined4 uStack_bfc;
  undefined8 local_bf8;
  poly2 local_be8;
  ulong local_b90;
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  anon_union_1408_2_d74be4fb_for_poly_0 local_b38;
  poly local_5b8;
  uint16_t uVar5;
  
  r_00 = out_pub->opaque + (-(int)out_pub & 0xf);
  if ((((ulong)r_00 & 0xf) != 0) ||
     (out_01 = (poly3 *)(out_priv->opaque + (-(int)out_priv & 0xf)), ((ulong)out_01 & 0xf) != 0)) {
    __assert_fail("((uintptr_t)ptr & (alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/../internal.h"
                  ,0xc0,"void *align_pointer(void *, size_t)");
  }
  scratch = (POLY_MUL_SCRATCH *)malloc_align32(&local_c50,0x9ce0);
  if (scratch == (POLY_MUL_SCRATCH *)0x0) {
    iVar13 = 0;
    memset(out_pub,0,0x590);
    RAND_bytes(out_priv->opaque,0x710);
  }
  else {
    memset(scratch,0xff,0x9ce0);
    cVar6 = *(crypto_word_t *)(in + 0x580);
    cVar7 = *(crypto_word_t *)(in + 0x588);
    cVar8 = *(crypto_word_t *)(in + 0x590);
    out_01[10].s.v[0] = *(crypto_word_t *)(in + 0x578);
    out_01[10].s.v[1] = cVar6;
    out_01[10].s.v[2] = cVar7;
    out_01[10].s.v[3] = cVar8;
    out = scratch + 1;
    poly_short_sample_plus((poly *)out,in);
    poly3_from_poly(out_01,(poly *)out);
    HRSS_poly3_invert(out_01 + 1,out_01);
    out_00 = (poly *)((long)&scratch[1].u + 0x580);
    poly_short_sample_plus(out_00,in + 700);
    lVar11 = 0x4630;
    do {
      *(short *)((long)&scratch->u + lVar11 * 2) = *(short *)((long)&scratch->u + lVar11 * 2) * 3;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x48ed);
    uVar3 = scratch[1].u.novec.scratch[2];
    lVar11 = 0x48ec;
    uVar5 = uVar3;
    do {
      uVar4 = *(uint16_t *)((long)scratch + lVar11 * 2 + -2);
      *(uint16_t *)((long)&scratch->u + lVar11 * 2) = uVar4 - uVar5;
      lVar11 = lVar11 + -1;
      uVar5 = uVar4;
    } while (lVar11 != 0x4630);
    scratch[1].u.novec.prod[0x2c0] = uVar3 - scratch[1].u.novec.prod[0x2c0];
    poly_mul(scratch,(poly *)((long)&scratch[1].u + 0xb00),(poly *)out,out_00);
    lVar11 = 0;
    do {
      local_5b8.field_0.v[lVar11] = -*(short *)((long)&scratch[1].u + lVar11 * 2 + 0xb00);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x2bd);
    local_5b8.field_0.v[0x2bf] = 0;
    local_5b8.field_0.vectors[0x57][1]._2_4_ = 0;
    local_b38.vectors[0][0] = 0;
    local_b38.vectors[0][1] = 0;
    local_b38.vectors[1][0] = 0;
    local_b38.vectors[1][1] = 0;
    local_b38.vectors[2][0] = 0;
    local_b38.vectors[2][1] = 0;
    local_b38.vectors[3][0] = 0;
    local_b38.vectors[3][1] = 0;
    local_b38.vectors[4][0] = 0;
    local_b38.vectors[4][1] = 0;
    local_b38.vectors[5][0] = 0;
    local_b88 = (undefined1  [16])0x0;
    local_b78 = (undefined1  [16])0x0;
    local_b68 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
    local_b48 = (undefined1  [16])0x0;
    local_b90 = 1;
    local_c48._0_4_ = 0xffffffff;
    local_c48._4_4_ = 0xffffffff;
    uStack_c40 = 0xffffffff;
    uStack_c3c = 0xffffffff;
    local_c38 = 0xffffffff;
    uStack_c34 = 0xffffffff;
    uStack_c30 = 0xffffffff;
    uStack_c2c = 0xffffffff;
    local_c28 = 0xffffffff;
    uStack_c24 = 0xffffffff;
    uStack_c20 = 0xffffffff;
    uStack_c1c = 0xffffffff;
    local_c18 = 0xffffffff;
    uStack_c14 = 0xffffffff;
    uStack_c10 = 0xffffffff;
    uStack_c0c = 0xffffffff;
    local_c08 = 0xffffffff;
    uStack_c04 = 0xffffffff;
    uStack_c00 = 0xffffffff;
    uStack_bfc = 0xffffffff;
    local_bf8 = 0x1fffffffffffffff;
    pcVar12 = local_be8.v;
    uVar17 = 0;
    lVar11 = 0x48f0;
    iVar13 = 0;
    do {
      uVar17 = (ulong)*(ushort *)((long)&scratch->u + lVar11 * 2) << 0x3f | uVar17 >> 1;
      iVar13 = iVar13 + 1;
      if (iVar13 == 0x40) {
        *pcVar12 = uVar17;
        pcVar12 = pcVar12 + 1;
        iVar13 = 0;
        uVar17 = 0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x4bad);
    *pcVar12 = uVar17 >> (-(char)iVar13 & 0x3fU);
    lVar11 = CONCAT17(local_be8.v[10]._7_1_,(undefined7)local_be8.v[10]);
    lVar14 = 0;
    do {
      local_be8.v[lVar14] = local_be8.v[lVar14] ^ (lVar11 << 3) >> 0x3f;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xb);
    local_be8.v[10]._7_1_ = local_be8.v[10]._7_1_ & 0xf;
    poly2_reverse_700(&local_be8,&local_be8);
    uVar10 = 1;
    lVar11 = 0;
    do {
      uVar9 = (uint)local_c48;
      uVar17 = 0;
      lVar14 = 0;
      do {
        uVar18 = *(ulong *)((long)&local_b38 + lVar14 * 8);
        lVar1 = uVar17 + uVar18 * 2;
        uVar17 = uVar18 >> 0x3f;
        *(long *)((long)&local_b38 + lVar14 * 8) = lVar1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      uVar16 = (uint)local_be8.v[0] & 1;
      uVar17 = -(ulong)uVar16;
      if ((int)uVar10 < 0) {
        uVar17 = 0;
      }
      if (uVar10 == 0) {
        uVar17 = 0;
      }
      lVar14 = 0;
      do {
        uVar18 = local_be8.v[lVar14];
        uVar20 = (uVar18 ^ (&local_c48)[lVar14]) & uVar17;
        (&local_c48)[lVar14] = (&local_c48)[lVar14] ^ uVar20;
        local_be8.v[lVar14] = uVar20 ^ uVar18;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      uVar18 = -(ulong)(uVar16 & uVar9);
      lVar14 = 0;
      do {
        local_be8.v[lVar14] = local_be8.v[lVar14] ^ (&local_c48)[lVar14] & uVar18;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      uVar19 = 10;
      uVar20 = 0;
      do {
        uVar21 = local_be8.v[uVar19];
        local_be8.v[uVar19] = uVar20 << 0x3f | uVar21 >> 1;
        uVar19 = uVar19 - 1;
        uVar20 = uVar21;
      } while (uVar19 < 0xb);
      lVar14 = 0;
      do {
        uVar20 = *(ulong *)((long)&local_b38 + lVar14 * 8);
        uVar19 = *(ulong *)(local_b88 + lVar14 * 8 + -8);
        uVar21 = (uVar19 ^ uVar20) & uVar17;
        *(ulong *)((long)&local_b38 + lVar14 * 8) = uVar20 ^ uVar21;
        *(ulong *)(local_b88 + lVar14 * 8 + -8) = uVar21 ^ uVar19;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      lVar14 = 0;
      do {
        *(ulong *)(local_b88 + lVar14 * 8 + -8) =
             *(ulong *)(local_b88 + lVar14 * 8 + -8) ^
             *(ulong *)((long)&local_b38 + lVar14 * 8) & uVar18;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      uVar10 = (-uVar10 & (uint)uVar17 | ~(uint)uVar17 & uVar10) + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x577);
    if (uVar10 != 0) {
      __assert_fail("delta == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x5f3,"void poly_invert_mod2(struct poly *, const struct poly *)");
    }
    if (((uint)local_c48 & 1) == 0) {
      __assert_fail("f.v[0] & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x5f4,"void poly_invert_mod2(struct poly *, const struct poly *)");
    }
    x = (poly *)((long)&scratch[1].u + 0x1080);
    out_02 = &local_b38;
    poly2_reverse_700((poly2 *)out_02,(poly2 *)out_02);
    iVar13 = 0;
    lVar11 = 0x4bb0;
    uVar15 = local_b38.vectors[0][0];
    do {
      *(ushort *)((long)&scratch->u + lVar11 * 2) = (ushort)uVar15 & 1;
      iVar13 = iVar13 + 1;
      if (iVar13 == 0x40) {
        uVar15 = *(crypto_word_t *)((long)out_02 + 8);
        out_02 = (anon_union_1408_2_d74be4fb_for_poly_0 *)((long)out_02 + 8);
        iVar13 = 0;
      }
      else {
        uVar15 = (ulong)uVar15 >> 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x4e6d);
    *(undefined2 *)((long)&scratch[1].u + 0x15fe) = 0;
    *(undefined4 *)((long)&scratch[1].u + 0x15fa) = 0;
    poly_assert_normalized(x);
    iVar13 = 4;
    do {
      poly_mul(scratch,(poly *)&local_b38,&local_5b8,x);
      local_b38.v[0] = local_b38.v[0] + 2;
      poly_mul(scratch,x,x,(poly *)&local_b38);
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    poly_assert_normalized(x);
    poly_mul(scratch,(poly *)r_00,x,out_00);
    poly_mul(scratch,(poly *)r_00,(poly *)r_00,out_00);
    lVar11 = 0;
    do {
      r_00[lVar11 * 2 + 1] = r_00[lVar11 * 2 + 1] & 0x1f;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x2bd);
    r = out_01 + 2;
    poly_mul(scratch,(poly *)r,x,(poly *)out);
    poly_mul(scratch,(poly *)r,(poly *)r,(poly *)out);
    lVar11 = 0xb0;
    do {
      pbVar2 = (byte *)((long)(out_01->s).v + lVar11 * 2 + 1);
      *pbVar2 = *pbVar2 & 0x1f;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x36d);
    OPENSSL_free(local_c50);
    iVar13 = 1;
  }
  return iVar13;
}

Assistant:

int HRSS_generate_key(
    struct HRSS_public_key *out_pub, struct HRSS_private_key *out_priv,
    const uint8_t in[HRSS_SAMPLE_BYTES + HRSS_SAMPLE_BYTES + 32]) {
  struct public_key *pub = public_key_from_external(out_pub);
  struct private_key *priv = private_key_from_external(out_priv);

  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    struct poly f;
    struct poly pg_phi1;
    struct poly pfg_phi1;
    struct poly pfg_phi1_inverse;
  };

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's later passed to
    // |HRSS_encap|.
    memset(out_pub, 0, sizeof(struct HRSS_public_key));
    RAND_bytes((uint8_t *)out_priv, sizeof(struct HRSS_private_key));
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  OPENSSL_memcpy(priv->hmac_key, in + 2 * HRSS_SAMPLE_BYTES,
                 sizeof(priv->hmac_key));

  poly_short_sample_plus(&vars->f, in);
  poly3_from_poly(&priv->f, &vars->f);
  HRSS_poly3_invert(&priv->f_inverse, &priv->f);

  // pg_phi1 is p (i.e. 3) × g × Φ(1) (i.e. 𝑥-1).
  poly_short_sample_plus(&vars->pg_phi1, in + HRSS_SAMPLE_BYTES);
  for (unsigned i = 0; i < N; i++) {
    vars->pg_phi1.v[i] *= 3;
  }
  poly_mul_x_minus_1(&vars->pg_phi1);

  poly_mul(&vars->scratch, &vars->pfg_phi1, &vars->f, &vars->pg_phi1);

  poly_invert(&vars->scratch, &vars->pfg_phi1_inverse, &vars->pfg_phi1);

  poly_mul(&vars->scratch, &pub->ph, &vars->pfg_phi1_inverse, &vars->pg_phi1);
  poly_mul(&vars->scratch, &pub->ph, &pub->ph, &vars->pg_phi1);
  poly_clamp(&pub->ph);

  poly_mul(&vars->scratch, &priv->ph_inverse, &vars->pfg_phi1_inverse,
           &vars->f);
  poly_mul(&vars->scratch, &priv->ph_inverse, &priv->ph_inverse, &vars->f);
  poly_clamp(&priv->ph_inverse);

  OPENSSL_free(malloc_ptr);
  return 1;
}